

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2App.cpp
# Opt level: O2

params * ParseParams(params *__return_storage_ptr__,int Argc,cstr *Argv)

{
  cstr *Val;
  idx2 *this;
  bool bVar1;
  dtype dVar2;
  size_t sVar3;
  ulong uVar4;
  action aVar5;
  metadata *Meta;
  int I;
  long lVar6;
  char *__ptr;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  float fVar10;
  f64 fVar11;
  stref Name;
  error<idx2::err_code> eVar12;
  stref sVar13;
  size_t sStack_90;
  anon_union_8_2_2df48d06_for_stref_0 local_80;
  uint local_78;
  char DType [8];
  FILE *Fp;
  undefined4 local_58;
  v3i Last3;
  
  idx2::params::params(__return_storage_ptr__);
  bVar1 = idx2::OptExists(Argc,Argv,"--encode");
  if (bVar1) {
    aVar5 = Encode;
  }
  else {
    bVar1 = idx2::OptExists(Argc,Argv,"--decode");
    aVar5 = Decode;
    if (!bVar1) {
      __return_storage_ptr__->Action = __Invalid__;
      __ptr = 
      "Provide either --encode or --decode\nExample 1: --encode /Users/abc/Miranda-Density-[384-384-256]-Float64.raw\nExample 2: --encode Miranda-Density-[384-384-256]-Float64.raw\nExample 3: --decode /Users/abc/Miranda/Density.idx2\nExample 4: --decode Miranda/Density.idx2\n"
      ;
      sStack_90 = 0x108;
      goto LAB_00104e65;
    }
  }
  __return_storage_ptr__->Action = aVar5;
  bVar1 = idx2::OptExists(Argc,Argv,"--pause");
  __return_storage_ptr__->Pause = bVar1;
  idx2::OptVal(Argc,Argv,"--out_dir",&__return_storage_ptr__->OutDir);
  idx2::OptVal(Argc,Argv,"--out_file",&__return_storage_ptr__->OutFile);
  bVar1 = idx2::OptExists(Argc,Argv,"--dry");
  __return_storage_ptr__->OutMode = (uint)bVar1 + (uint)bVar1 * 2;
  if (__return_storage_ptr__->Action == Decode) {
    bVar1 = idx2::OptVal(Argc,Argv,"--decode",&__return_storage_ptr__->InputFile);
    if (bVar1) {
      bVar1 = idx2::OptExists(Argc,Argv,"--first");
      if ((!bVar1) && (bVar1 = idx2::OptExists(Argc,Argv,"--last"), !bVar1)) {
LAB_00104f6a:
        idx2::OptVal(Argc,Argv,"--downsampling",&__return_storage_ptr__->DownsamplingFactor3);
        idx2::OptVal(Argc,Argv,"--tolerance",&__return_storage_ptr__->DecodeTolerance);
        idx2::OptVal(Argc,Argv,"--in_dir",&__return_storage_ptr__->InDir);
        bVar1 = idx2::OptExists(Argc,Argv,"--in_dir");
        if (!bVar1) {
          local_80 = (anon_union_8_2_2df48d06_for_stref_0)__return_storage_ptr__->InputFile;
          sVar3 = strlen(local_80.Ptr);
          local_78 = (uint)sVar3;
          sVar13 = idx2::GetParentPath((stref *)&local_80);
          DType = (char  [8])sVar13.field_0;
          sVar13 = idx2::GetParentPath((stref *)DType);
          (__return_storage_ptr__->InDir).field_0 = sVar13.field_0;
          (__return_storage_ptr__->InDir).Size = sVar13.Size;
          bVar1 = idx2::operator==(&__return_storage_ptr__->InDir,(stref *)DType);
          if (bVar1) {
            (__return_storage_ptr__->InDir).field_0.Ptr = "./";
            (__return_storage_ptr__->InDir).Size = 2;
          }
        }
        bVar1 = idx2::OptExists(Argc,Argv,"--brick_map");
        if (bVar1) {
          __return_storage_ptr__->OutMode = HashMap;
        }
        bVar1 = idx2::OptExists(Argc,Argv,"--parallel");
        __return_storage_ptr__->ParallelDecode = bVar1;
        return __return_storage_ptr__;
      }
      bVar1 = idx2::OptVal(Argc,Argv,"--first",(v3i *)&Fp);
      if (bVar1) {
        bVar1 = idx2::OptVal(Argc,Argv,"--last",&Last3);
        if (bVar1) {
          (__return_storage_ptr__->DecodeExtent).From =
               (ulong)(local_58 & 0x1fffff) << 0x2a |
               ((ulong)Fp._4_4_ & 0x1fffff) << 0x15 | (ulong)Fp & 0x1fffff;
          (__return_storage_ptr__->DecodeExtent).Dims =
               (ulong)((Last3.field_0.field_0.Z - local_58) + 1U & 0x1fffff) << 0x2a |
               (ulong)((Last3.field_0.field_0.Y - Fp._4_4_) + 1 & 0x1fffff) << 0x15 |
               (ulong)((Last3.field_0.field_0.X - (int)Fp) + 1U & 0x1fffff);
          goto LAB_00104f6a;
        }
        __ptr = 
        "Provide --last (the last sample of the box to decode)\nExample: --first 919 655 719\n";
        sStack_90 = 0x53;
      }
      else {
        __ptr = 
        "Provide --first (the first sample of the box to decode)\nExample: --first 0 400 0\n";
        sStack_90 = 0x51;
      }
      goto LAB_00104e65;
    }
    __ptr = "Provide input file after --decode\n";
  }
  else {
    if (__return_storage_ptr__->Action != Encode) {
      return __return_storage_ptr__;
    }
    Val = &__return_storage_ptr__->InputFile;
    Meta = (metadata *)Val;
    bVar1 = idx2::OptVal(Argc,Argv,"--encode",Val);
    if (bVar1) {
      this = (idx2 *)__return_storage_ptr__->InputFile;
      sVar3 = strlen((char *)this);
      sVar13.field_0.Ptr = (str)(sVar3 & 0xffffffff);
      sVar13._8_8_ = &__return_storage_ptr__->Meta;
      eVar12 = idx2::StrToMetaData(this,sVar13,Meta);
      if (eVar12.Code != NoError) {
        bVar1 = idx2::OptVal(Argc,Argv,"--name",(__return_storage_ptr__->Meta).Name);
        if (!bVar1) {
          __ptr = "Provide --name\nExample: --name Miranda\n";
          sStack_90 = 0x27;
          goto LAB_00104e65;
        }
        bVar1 = idx2::OptVal(Argc,Argv,"--field",(__return_storage_ptr__->Meta).Field);
        if (!bVar1) {
          __ptr = "Provide --field\nExample: --field Density\n";
          sStack_90 = 0x29;
          goto LAB_00104e65;
        }
        bVar1 = idx2::OptVal(Argc,Argv,"--dims",&(__return_storage_ptr__->Meta).Dims3);
        if (!bVar1) {
          __ptr = "Provide --dims\nExample: --dims 384 384 256\n";
          sStack_90 = 0x2b;
          goto LAB_00104e65;
        }
        bVar1 = idx2::OptVal(Argc,Argv,"--type",DType);
        if (!bVar1) {
          __ptr = "Provide --type (float32 or float64)\nExample: --type float32\n";
          sStack_90 = 0x3c;
          goto LAB_00104e65;
        }
        sVar3 = strlen(DType);
        Name._8_8_ = sVar3 & 0xffffffff;
        Name.field_0.Ptr = DType;
        dVar2 = idx2::StringTo<idx2::dtype>::operator()((StringTo<idx2::dtype> *)&local_80,Name);
        (__return_storage_ptr__->Meta).DType = dVar2;
        if ((dVar2 & ~uint8) != float32) {
          __ptr = "Unsupported type\n";
          sStack_90 = 0x11;
          goto LAB_00104e65;
        }
        local_80.ConstPtr = *Val;
        sVar3 = strlen(local_80.Ptr);
        local_78 = (uint)sVar3;
        sVar13 = idx2::GetExtension((stref *)&local_80);
        DType = (char  [8])sVar13.field_0;
        Fp = (FILE *)anon_var_dwarf_35f9;
        local_58 = 3;
        bVar1 = idx2::operator==((stref *)DType,(stref *)&Fp);
        if (bVar1) {
          Fp = (FILE *)fopen(__return_storage_ptr__->InputFile,"rb");
          local_78 = local_78 & 0xffffff00;
          local_80.Ptr = (str)&Fp;
          idx2::ReadLines<256>(Fp,&__return_storage_ptr__->InputFiles);
          lVar8 = 0;
          lVar6 = 0;
          uVar7 = 0;
          do {
            if (lVar6 == (__return_storage_ptr__->InputFiles).Size) {
              uVar4 = (ulong)(__return_storage_ptr__->Meta).DType;
              if (uVar4 < 10) {
                uVar4 = *(ulong *)(&DAT_0018efd8 + uVar4 * 8);
              }
              else {
                uVar4 = 0xffffffffffffffff;
              }
              if ((uVar4 & uVar7) == 0) {
                idx2::
                scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Applications/idx2App.cpp:128:7)>
                ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Applications_idx2App_cpp:128:7)>
                                *)&local_80);
                goto LAB_001050a9;
              }
              __ptr = "File size not multiple of dtype size\n";
              sStack_90 = 0x25;
              goto LAB_00104e65;
            }
            DType = (char  [8])((long)(__return_storage_ptr__->InputFiles).Buffer.Data + lVar8);
            strlen((char *)DType);
            uVar4 = idx2::GetFileSize((stref *)DType);
            bVar1 = lVar8 == 0;
            bVar9 = uVar7 == uVar4;
            lVar6 = lVar6 + 1;
            lVar8 = lVar8 + 0x101;
            uVar7 = uVar4;
          } while (bVar9 || bVar1);
          __ptr = "Input files have to be of the same size\n";
          sStack_90 = 0x28;
          goto LAB_00104e65;
        }
      }
LAB_001050a9:
      if ((__return_storage_ptr__->Meta).DType == __Invalid__) {
        __ptr = "Data type not supported\n";
        sStack_90 = 0x18;
        goto LAB_00104e65;
      }
      idx2::OptVal(Argc,Argv,"--brick_size",&__return_storage_ptr__->BrickDims3);
      idx2::OptVal(Argc,Argv,"--num_levels",&__return_storage_ptr__->NLevels);
      idx2::OptVal(Argc,Argv,"--tolerance",&__return_storage_ptr__->Tolerance);
      if (0.0 < (double)__return_storage_ptr__->Tolerance) goto LAB_00105148;
      dVar2 = (__return_storage_ptr__->Meta).DType;
      if (dVar2 == float64) {
        fVar11 = (f64)idx2::GetMachineEpsilon<double>();
LAB_00105134:
        __return_storage_ptr__->Tolerance = fVar11;
      }
      else if (dVar2 == float32) {
        fVar10 = idx2::GetMachineEpsilon<float>();
        fVar11 = (f64)(double)fVar10;
        goto LAB_00105134;
      }
      printf("tolerance = %.16f (machine epsilon)\n");
LAB_00105148:
      idx2::OptVal(Argc,Argv,"--bit_planes_per_chunk",&__return_storage_ptr__->BitPlanesPerChunk);
      idx2::OptVal(Argc,Argv,"--bit_planes_per_file",&__return_storage_ptr__->BitPlanesPerFile);
      idx2::OptVal(Argc,Argv,"--bricks_per_chunk",&__return_storage_ptr__->BricksPerChunk);
      idx2::OptVal(Argc,Argv,"--chunks_per_file",&__return_storage_ptr__->ChunksPerFile);
      idx2::OptVal(Argc,Argv,"--files_per_dir",&__return_storage_ptr__->FilesPerDir);
      idx2::OptVal(Argc,Argv,"--version",&__return_storage_ptr__->Version);
      idx2::OptVal(Argc,Argv,"--out_dir",&__return_storage_ptr__->OutDir);
      return __return_storage_ptr__;
    }
    __ptr = "Provide input file after --encode\n";
  }
  sStack_90 = 0x22;
LAB_00104e65:
  fwrite(__ptr,sStack_90,1,_stderr);
  exit(1);
}

Assistant:

params
ParseParams(int Argc, cstr* Argv)
{
  params P;

  P.Action = OptExists(Argc, Argv, "--encode")   ? action::Encode
             : OptExists(Argc, Argv, "--decode") ? P.Action = action::Decode
                                                 : action::__Invalid__;

  idx2_ExitIf(P.Action == action::__Invalid__,
              "Provide either --encode or --decode\n"
              "Example 1: --encode /Users/abc/Miranda-Density-[384-384-256]-Float64.raw\n"
              "Example 2: --encode Miranda-Density-[384-384-256]-Float64.raw\n"
              "Example 3: --decode /Users/abc/Miranda/Density.idx2\n"
              "Example 4: --decode Miranda/Density.idx2\n");

  //// Parse the input file (--input)
  //idx2_ExitIf(!OptVal(Argc, Argv, "--input", &P.InputFile),
  //            "Provide --input\n"
  //            "Example: --input /Users/abc/MIRANDA-DENSITY-[384-384-256]-Float64.raw\n");

  // Parse the pause option (--pause): wait for keyboard input at the end
  P.Pause = OptExists(Argc, Argv, "--pause");

  // Parse the optional output directory (--out_dir)
  OptVal(Argc, Argv, "--out_dir", &P.OutDir);
  // Parse the optional output file (--out_file)
  OptVal(Argc, Argv, "--out_file", &P.OutFile);

  // Parse the dry run option (--dry): if enabled, skip writing the output file
  P.OutMode =
    OptExists(Argc, Argv, "--dry") ? params::out_mode::NoOutput : params::out_mode::RegularGridFile;

  // Perform parsing depending on the action
  if (P.Action == action::Encode)
    ParseEncodeOptions(Argc, Argv, &P);
  else if (P.Action == action::Decode)
    ParseDecodeOptions(Argc, Argv, &P);

  return P;
}